

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

StandardNeeded __thiscall
anon_unknown.dwarf_5c1678::StandardLevelComputer::HighestStandardNeeded
          (StandardLevelComputer *this,cmMakefile *makefile,string *feature)

{
  pointer pbVar1;
  bool bVar2;
  cmValue cVar3;
  long lVar4;
  ulong uVar5;
  string_view arg;
  uint local_ec;
  ulong local_e8;
  string prefix;
  cmAlphaNum local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string local_50;
  
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x5bff0d;
  local_b0.View_._M_str = (this->Language)._M_dataplus._M_p;
  local_b0.View_._M_len = (this->Language)._M_string_length;
  cmStrCat<>(&prefix,(cmAlphaNum *)&props,&local_b0);
  lVar4 = 8;
  local_ec = 0xffffffff;
  local_e8 = 0xffffffffffffffff;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)prefix._M_string_length;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)prefix._M_dataplus._M_p;
    pbVar1 = (this->LevelsAsStrings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b0.View_._M_str = *(char **)((long)pbVar1 + lVar4 + -8);
    local_b0.View_._M_len = *(size_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4);
    cmStrCat<char[18]>(&local_50,(cmAlphaNum *)&props,&local_b0,(char (*) [18])0x5e6e8e);
    cVar3 = cmMakefile::GetDefinition(makefile,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (cVar3.Value != (string *)0x0) {
      arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&props,arg,false);
      bVar2 = ::cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&props,feature);
      if (bVar2) {
        local_e8 = (ulong)(uint)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar5];
        local_ec = (uint)uVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&props);
    }
    lVar4 = lVar4 + 0x20;
  }
  std::__cxx11::string::~string((string *)&prefix);
  return (StandardNeeded)((ulong)local_ec | local_e8 << 0x20);
}

Assistant:

StandardNeeded HighestStandardNeeded(cmMakefile* makefile,
                                       std::string const& feature) const
  {
    std::string prefix = cmStrCat("CMAKE_", this->Language);
    StandardNeeded maxLevel = { -1, -1 };
    for (size_t i = 0; i < this->Levels.size(); ++i) {
      if (cmValue prop = makefile->GetDefinition(
            cmStrCat(prefix, this->LevelsAsStrings[i], "_COMPILE_FEATURES"))) {
        std::vector<std::string> props = cmExpandedList(*prop);
        if (cm::contains(props, feature)) {
          maxLevel = { static_cast<int>(i), this->Levels[i] };
        }
      }
    }
    return maxLevel;
  }